

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Value::insert(Value *this,ArrayIndex index,Value *newValue)

{
  ArrayIndex AVar1;
  Value *pVVar2;
  Value *other;
  ArrayIndex index_00;
  OStringStream oss;
  String local_1c8;
  ostringstream local_1a8 [376];
  
  if ((*(char *)&this->bits_ != '\0') && (*(char *)&this->bits_ != '\x06')) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"in Json::Value::insert: requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1c8);
  }
  AVar1 = size(this);
  index_00 = AVar1;
  if (index <= AVar1) {
    while (index < index_00) {
      pVVar2 = operator[](this,index_00 - 1);
      other = operator[](this,index_00);
      swap(pVVar2,other);
      index_00 = index_00 - 1;
    }
    pVVar2 = operator[](this,index);
    swap(newValue,pVVar2);
  }
  return index <= AVar1;
}

Assistant:

bool Value::insert(ArrayIndex index, Value&& newValue) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::insert: requires arrayValue");
  ArrayIndex length = size();
  if (index > length) {
    return false;
  }
  for (ArrayIndex i = length; i > index; i--) {
    (*this)[i] = std::move((*this)[i - 1]);
  }
  (*this)[index] = std::move(newValue);
  return true;
}